

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_example_test.c
# Opt level: O2

void add_and_wait_mu(string_priority_queue_mu *q,nsync_time delay,int n,char **s)

{
  char *e0;
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *e1;
  char **ppcVar4;
  int iVar5;
  int iVar6;
  
  uVar3 = 0;
  do {
    if (uVar3 == (uint)n) {
      return;
    }
    e0 = s[uVar3];
    nsync_mu_lock(&q->mu);
    iVar6 = (q->heap).h_.len_;
    a_ensure_(&q->heap,1,8);
    ppcVar4 = (q->heap).a_;
    iVar2 = (q->heap).h_.len_;
    (q->heap).h_.len_ = iVar2 + 1;
    e1 = e0;
    do {
      iVar5 = iVar6;
      ppcVar4[iVar2] = e1;
      ppcVar4 = (q->heap).a_;
      if (iVar5 == 0) break;
      iVar6 = iVar5 + -1 >> 1;
      e1 = ppcVar4[iVar6];
      iVar1 = str_lt(e0,e1);
      iVar2 = iVar5;
    } while (iVar1 != 0);
    ppcVar4[iVar5] = e0;
    nsync_mu_unlock(&q->mu);
    nsync_time_sleep(delay);
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static void add_and_wait_mu (string_priority_queue_mu *q,
			     nsync_time delay, int n, const char *s[]) {
	int i;
	for (i = 0; i != n; i++) {
		string_priority_queue_mu_add (q, s[i]);
		nsync_time_sleep (delay);
	}
}